

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

size_t * scope_stack_return(scope sp)

{
  ulong uVar1;
  long *plVar2;
  long in_RDI;
  size_t *size_return_ptr;
  void **return_ptr;
  size_t return_position;
  size_t call_stack_size;
  size_t *local_8;
  
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x10) == 0)) {
    log_write_impl_va("metacall",0x1fa,"scope_stack_return",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                      ,3,"Scope stack return invalid parameters");
    local_8 = (size_t *)0x0;
  }
  else {
    uVar1 = vector_size(*(undefined8 *)(in_RDI + 0x10));
    if (uVar1 < 8) {
      log_write_impl_va("metacall",0x1f5,"scope_stack_return",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                        ,3,"Scope stack return empty");
      local_8 = (size_t *)0x0;
    }
    else {
      plVar2 = (long *)vector_at(*(undefined8 *)(in_RDI + 0x10),uVar1 - 9);
      if ((plVar2 == (long *)0x0) || (*plVar2 == 0)) {
        log_write_impl_va("metacall",0x1f0,"scope_stack_return",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                          ,3,"Scope stack return invalid reference");
        local_8 = (size_t *)0x0;
      }
      else {
        local_8 = (size_t *)*plVar2;
      }
    }
  }
  return local_8;
}

Assistant:

size_t *scope_stack_return(scope sp)
{
	if (sp != NULL && sp->call_stack != NULL)
	{
		size_t call_stack_size = vector_size(sp->call_stack);

		if (call_stack_size >= sizeof(size_t))
		{
			size_t return_position = call_stack_size - 1 - sizeof(size_t);

			void **return_ptr = vector_at(sp->call_stack, return_position);

			if (return_ptr != NULL && *return_ptr != NULL)
			{
				size_t *size_return_ptr = *return_ptr;

				return size_return_ptr;
			}

			log_write("metacall", LOG_LEVEL_ERROR, "Scope stack return invalid reference");

			return NULL;
		}

		log_write("metacall", LOG_LEVEL_ERROR, "Scope stack return empty");

		return NULL;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Scope stack return invalid parameters");

	return NULL;
}